

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  byte *__dest;
  ulong uVar10;
  FILE *pFVar11;
  byte *pbVar12;
  byte bVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  byte *pbVar19;
  uint uVar20;
  char command [100];
  char arg [400];
  int local_4d8;
  undefined4 local_4c8;
  char cStack_4c4;
  undefined1 uStack_4c3;
  undefined1 uStack_4c2;
  undefined1 uStack_4c1;
  long local_458 [20];
  byte local_3b8 [400];
  char local_228 [500];
  undefined1 local_34;
  
  if (argc < 2) {
    printf("Usage : %s [options] catalogfile entities...\n\tParse the catalog file (void specification possibly expressed as \"\"\n\tappoints the default system one) and query it for the entities\n\t--sgml : handle SGML Super catalogs for --add and --del\n\t--shell : run a shell allowing interactive queries\n\t--create : create a new catalog\n\t--add \'type\' \'orig\' \'replace\' : add an XML entry\n\t--add \'entry\' : add an SGML entry\n"
           ,*argv);
    puts(
        "\t--del \'values\' : remove values\n\t--noout: avoid dumping the result on stdout\n\t         used with --add or --del, it saves the catalog changes\n\t         and with --sgml it automatically updates the super catalog\n\t--no-super-update: do not update the SGML super catalog\n\t-v --verbose : provide debug information"
        );
    return 1;
  }
  xmlCheckVersion(0x5398);
  iVar17 = 1;
  do {
    pcVar8 = argv[iVar17];
    if ((*pcVar8 != '-') || (pcVar8[1] == '\0')) break;
    iVar3 = strcmp(pcVar8,"-verbose");
    if ((iVar3 == 0) ||
       (((pcVar8[1] == 'v' && (pcVar8[2] == '\0')) ||
        (iVar3 = strcmp(pcVar8,"--verbose"), iVar3 == 0)))) {
      verbose = verbose + 1;
      xmlCatalogSetDebug();
    }
    else {
      iVar3 = strcmp(pcVar8,"-noout");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar8,"--noout"), iVar3 != 0)) {
        iVar3 = strcmp(pcVar8,"-shell");
        if ((iVar3 != 0) && (iVar3 = strcmp(pcVar8,"--shell"), iVar3 != 0)) {
          iVar3 = strcmp(pcVar8,"-sgml");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--sgml"), iVar3 == 0)) {
            sgml = sgml + 1;
          }
          else {
            iVar3 = strcmp(pcVar8,"-create");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--create"), iVar3 == 0)) {
              create = create + 1;
            }
            else {
              iVar3 = strcmp(pcVar8,"-convert");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--convert"), iVar3 == 0)) {
                convert = convert + 1;
              }
              else {
                iVar3 = strcmp(pcVar8,"-no-super-update");
                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--no-super-update"), iVar3 == 0)) {
                  no_super_update = no_super_update + 1;
                }
                else {
                  iVar3 = strcmp(pcVar8,"-add");
                  if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--add"), iVar3 == 0)) {
                    iVar17 = iVar17 + 2 + (uint)(sgml == 0);
                    add = add + 1;
                  }
                  else {
                    iVar3 = strcmp(pcVar8,"-del");
                    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar8,"--del"), iVar3 != 0)) {
                      main_cold_1();
                      return 1;
                    }
                    iVar17 = iVar17 + 1;
                    del = del + 1;
                  }
                }
              }
            }
          }
          goto LAB_0010273a;
        }
        shell = shell + 1;
      }
      noout = 1;
    }
LAB_0010273a:
    iVar17 = iVar17 + 1;
  } while (iVar17 < argc);
  iVar17 = sgml;
  uVar18 = 1;
  do {
    pcVar8 = argv[(int)uVar18];
    iVar3 = strcmp(pcVar8,"-add");
    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--add"), iVar3 == 0)) {
      if (iVar17 == 0) {
        uVar20 = uVar18 + 3;
      }
      else {
        uVar20 = uVar18 + 2;
      }
    }
    else {
      iVar3 = strcmp(pcVar8,"-del");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--del"), iVar3 == 0)) {
        uVar20 = uVar18 + 1;
        if ((uVar20 == argc) || ((iVar17 != 0 && (uVar18 + 2 == argc)))) {
          main_cold_2();
          return 1;
        }
      }
      else {
        uVar20 = uVar18;
        if (*pcVar8 != '-') {
          if ((*pcVar8 == '\0') && (filename == (char *)0x0)) {
            xmlInitializeCatalog();
          }
          else {
            filename = pcVar8;
            iVar17 = xmlLoadCatalog(pcVar8);
            if ((iVar17 < 0) && (create != 0)) {
              xmlCatalogAdd("catalog",argv[(int)uVar18],0);
            }
            xmlCatalogResolvePublic("");
          }
          break;
        }
      }
    }
    uVar18 = uVar20 + 1;
  } while ((int)uVar18 < argc);
  if (convert != 0) {
    xmlCatalogConvert();
  }
  if (del == 0 && add == 0) {
    if (shell == 0) {
      iVar17 = uVar18 + 1;
      local_4d8 = 0;
      if (iVar17 < argc) {
        lVar6 = 0;
        local_4d8 = 0;
        do {
          lVar7 = xmlParseURI(argv[iVar17 + lVar6]);
          if (lVar7 == 0) {
            pcVar8 = (char *)xmlCatalogResolvePublic(argv[iVar17 + lVar6]);
            if (pcVar8 != (char *)0x0) goto LAB_00103258;
            pcVar8 = argv[iVar17 + lVar6];
            pcVar16 = "No entry for PUBLIC %s\n";
LAB_00103277:
            printf(pcVar16,pcVar8);
            local_4d8 = 4;
          }
          else {
            xmlFreeURI(lVar7);
            pcVar8 = (char *)xmlCatalogResolveSystem(argv[iVar17 + lVar6]);
            if (pcVar8 == (char *)0x0) {
              printf("No entry for SYSTEM %s\n",argv[iVar17 + lVar6]);
              pcVar8 = (char *)xmlCatalogResolveURI(argv[iVar17 + lVar6]);
              if (pcVar8 == (char *)0x0) {
                pcVar8 = argv[iVar17 + lVar6];
                pcVar16 = "No entry for URI %s\n";
                goto LAB_00103277;
              }
            }
LAB_00103258:
            puts(pcVar8);
            (*_xmlFree)(pcVar8);
          }
          lVar6 = lVar6 + 1;
        } while (~uVar18 + argc != (int)lVar6);
      }
    }
    else {
      fputs("> ",_stdout);
      fflush(_stdout);
      pcVar8 = fgets(local_228,500,_stdin);
      if (pcVar8 != (char *)0x0) {
        do {
          local_34 = 0;
          sVar9 = strlen(local_228);
          sVar9 = (size_t)((int)sVar9 + 1);
          __dest = (byte *)malloc(sVar9);
          if (__dest == (byte *)0x0) break;
          memcpy(__dest,local_228,sVar9);
          for (pbVar19 = __dest; (bVar13 = *pbVar19, bVar13 == 9 || (bVar13 == 0x20));
              pbVar19 = pbVar19 + 1) {
          }
          uVar10 = 0;
          while ((uVar14 = (ulong)bVar13, 0x20 < bVar13 ||
                 ((0x100002601U >> (uVar14 & 0x3f) & 1) == 0))) {
            *(byte *)((long)&local_4c8 + uVar10) = bVar13;
            bVar13 = pbVar19[uVar10 + 1];
            uVar10 = uVar10 + 1;
          }
          *(undefined1 *)((long)&local_4c8 + (uVar10 & 0xffffffff)) = 0;
          if (uVar10 == 0) goto LAB_00103135;
          pbVar19 = pbVar19 + uVar10;
          memset(local_3b8,0,400);
          while (((char)uVar14 == '\t' || ((int)uVar14 == 0x20))) {
            pbVar12 = pbVar19 + 1;
            pbVar19 = pbVar19 + 1;
            uVar14 = (ulong)*pbVar12;
          }
          uVar10 = 0;
          while ((0xd < (byte)uVar14 || ((0x2401U >> ((uint)uVar14 & 0x1f) & 1) == 0))) {
            local_3b8[uVar10] = (byte)uVar14;
            uVar14 = (ulong)pbVar19[uVar10 + 1];
            uVar10 = uVar10 + 1;
          }
          local_3b8[uVar10 & 0xffffffff] = 0;
          iVar17 = 0;
          memset(local_458,0,0xa0);
          if (local_3b8[0] != 0) {
            lVar6 = 0;
            iVar17 = 0;
            pbVar19 = local_3b8;
            bVar13 = local_3b8[0];
LAB_00102d8f:
            do {
              pbVar12 = pbVar19 + 1;
              if (bVar13 < 0x20) {
                if (bVar13 == 9) goto LAB_00102dc7;
LAB_00102de4:
                local_458[lVar6] = (long)pbVar19;
                pbVar12 = pbVar19;
                while ((0x20 < (ulong)*pbVar12 ||
                       ((0x100000201U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))) {
                  pbVar12 = pbVar12 + 1;
                }
              }
              else {
                if (bVar13 == 0x20) {
LAB_00102dc7:
                  bVar13 = *pbVar12;
                  pbVar19 = pbVar12;
                  goto LAB_00102d8f;
                }
                if (bVar13 == 0x22) {
                  local_458[lVar6] = (long)pbVar12;
                  while( true ) {
                    if (*pbVar12 == 0) goto LAB_00102e19;
                    if (*pbVar12 == 0x22) break;
                    pbVar12 = pbVar12 + 1;
                  }
                }
                else {
                  if (bVar13 != 0x27) goto LAB_00102de4;
                  local_458[lVar6] = (long)pbVar12;
                  while( true ) {
                    if (*pbVar12 == 0) goto LAB_00102e19;
                    if (*pbVar12 == 0x27) break;
                    pbVar12 = pbVar12 + 1;
                  }
                }
              }
              *pbVar12 = 0;
              iVar17 = iVar17 + 1;
              lVar6 = lVar6 + 1;
              bVar13 = pbVar12[1];
              pbVar19 = pbVar12 + 1;
            } while (bVar13 != 0);
          }
LAB_00102e19:
          lVar6 = local_458[0];
          if (((cStack_4c4 == '\0' && local_4c8 == 0x74697865) ||
              (cStack_4c4 == '\0' && local_4c8 == 0x74697571)) || (local_4c8 == 0x657962)) {
            free(__dest);
            break;
          }
          if (CONCAT13(uStack_4c2,CONCAT12(uStack_4c3,CONCAT11(cStack_4c4,local_4c8._3_1_))) ==
              0x63696c && local_4c8 == 0x6c627570) {
            if (iVar17 != 1) {
              pcVar8 = "public requires 1 arguments";
              goto LAB_00103130;
            }
            pcVar8 = (char *)xmlCatalogResolvePublic(local_458[0]);
            if (pcVar8 != (char *)0x0) goto LAB_00102eff;
            pcVar8 = "No entry for PUBLIC %s\n";
LAB_001030ce:
            printf(pcVar8,lVar6);
          }
          else {
            if (CONCAT13(uStack_4c2,CONCAT12(uStack_4c3,CONCAT11(cStack_4c4,local_4c8._3_1_))) ==
                0x6d6574 && local_4c8 == 0x74737973) {
              if (iVar17 == 1) {
                pcVar8 = (char *)xmlCatalogResolveSystem(local_458[0]);
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "No entry for SYSTEM %s\n";
                  goto LAB_001030ce;
                }
LAB_00102eff:
                puts(pcVar8);
LAB_00102f0d:
                (*_xmlFree)(pcVar8);
                goto LAB_00103135;
              }
              pcVar8 = "system requires 1 arguments";
            }
            else if (local_4c8 == 0x6c6564) {
              if (iVar17 == 1) {
                iVar17 = xmlCatalogRemove(local_458[0]);
                if (0 < iVar17) goto LAB_00103135;
                pcVar8 = "del command failed";
              }
              else {
                pcVar8 = "del requires 1";
              }
            }
            else if (local_4c8 == 0x646461) {
              if (iVar17 - 4U < 0xfffffffe) {
                pcVar8 = "add requires 2 or 3 arguments";
              }
              else {
                lVar6 = local_458[2];
                lVar7 = local_458[1];
                if (local_458[2] == 0) {
                  lVar6 = local_458[1];
                  lVar7 = 0;
                }
                iVar17 = xmlCatalogAdd(local_458[0],lVar7,lVar6);
                if (iVar17 == 0) goto LAB_00103135;
                pcVar8 = "add command failed";
              }
            }
            else if (CONCAT17(uStack_4c1,
                              CONCAT16(uStack_4c2,
                                       CONCAT15(uStack_4c3,CONCAT14(cStack_4c4,local_4c8)))) ==
                     0x65766c6f736572) {
              if (iVar17 == 2) {
                pcVar8 = (char *)xmlCatalogResolve(local_458[0],local_458[1]);
                if (pcVar8 != (char *)0x0) {
                  puts(pcVar8);
                  goto LAB_00102f0d;
                }
                pcVar8 = "Resolver failed to find an answer";
              }
              else {
                pcVar8 = "resolve requires 2 arguments";
              }
            }
            else if (cStack_4c4 == '\0' && local_4c8 == 0x706d7564) {
              if (iVar17 == 0) {
                xmlCatalogDump(_stdout);
                goto LAB_00103135;
              }
              pcVar8 = "dump has no arguments";
            }
            else if (CONCAT11(uStack_4c3,cStack_4c4) == 0x67 && local_4c8 == 0x75626564) {
              if (iVar17 == 0) {
                verbose = verbose + 1;
LAB_001031af:
                xmlCatalogSetDebug();
                goto LAB_00103135;
              }
              pcVar8 = "debug has no arguments";
            }
            else if (CONCAT11(uStack_4c3,cStack_4c4) == 0x74 && local_4c8 == 0x65697571) {
              if (iVar17 == 0) {
                if (0 < verbose) {
                  verbose = verbose + -1;
                }
                goto LAB_001031af;
              }
              pcVar8 = "quiet has no arguments";
            }
            else {
              if (cStack_4c4 != '\0' || local_4c8 != 0x706c6568) {
                printf("Unrecognized command %s\n",&local_4c8);
              }
              puts("Commands available:");
              puts("\tpublic PublicID: make a PUBLIC identifier lookup");
              puts("\tsystem SystemID: make a SYSTEM identifier lookup");
              puts("\tresolve PublicID SystemID: do a full resolver lookup");
              puts("\tadd \'type\' \'orig\' \'replace\' : add an entry");
              puts("\tdel \'values\' : remove values");
              puts("\tdump: print the current catalog state");
              puts("\tdebug: increase the verbosity level");
              puts("\tquiet: decrease the verbosity level");
              pcVar8 = "\texit:  quit the shell";
            }
LAB_00103130:
            puts(pcVar8);
          }
LAB_00103135:
          free(__dest);
          fputs("> ",_stdout);
          fflush(_stdout);
          pcVar8 = fgets(local_228,500,_stdin);
        } while (pcVar8 != (char *)0x0);
      }
      local_4d8 = 0;
    }
  }
  else {
    local_4d8 = 0;
    iVar17 = 1;
    do {
      pcVar8 = argv[iVar17];
      iVar3 = iVar17;
      if (*pcVar8 == '-') {
        if (pcVar8[1] == '\0') break;
        ppcVar2 = argv + iVar17;
        iVar4 = strcmp(pcVar8,"-add");
        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar8,"--add"), iVar4 == 0)) {
          if (sgml == 0) {
LAB_00102a6f:
            pcVar8 = argv[(long)iVar17 + 3];
            if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
              pcVar16 = ppcVar2[1];
              pcVar8 = ppcVar2[2];
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar16 = ppcVar2[1];
              pcVar15 = ppcVar2[2];
            }
            iVar4 = xmlCatalogAdd(pcVar16,pcVar15,pcVar8);
            iVar3 = iVar17 + 3;
            if (iVar4 != 0) {
              puts("add command failed");
              local_4d8 = 3;
            }
          }
          else {
LAB_0010296f:
            ppcVar1 = ppcVar2 + 1;
            lVar6 = xmlLoadSGMLSuperCatalog(ppcVar2[1]);
            pcVar8 = *ppcVar2;
            iVar3 = strcmp(pcVar8,"-add");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--add"), iVar3 == 0)) {
              if (lVar6 == 0) {
                lVar6 = xmlNewCatalog(1);
              }
              xmlACatalogAdd(lVar6,"CATALOG",ppcVar2[2],0);
              if (no_super_update == 0) {
                lVar7 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
                if (lVar7 == 0) {
                  lVar7 = xmlNewCatalog(1);
                }
                xmlACatalogAdd(lVar7,"CATALOG",*ppcVar1,0);
              }
              else {
LAB_00102a67:
                lVar7 = 0;
              }
LAB_00102af7:
              if (noout != 0) goto LAB_00102b00;
LAB_00102b20:
              xmlACatalogDump(lVar6,_stdout);
            }
            else {
              if ((lVar6 == 0) || (iVar3 = xmlACatalogRemove(lVar6,ppcVar2[2]), iVar3 < 0)) {
                main_cold_4();
                local_4d8 = 1;
              }
              if (((lVar6 != 0) && (no_super_update == 0)) && ((noout & 1) != 0)) {
                iVar3 = xmlCatalogIsEmpty(lVar6);
                if ((iVar3 == 0) ||
                   (lVar7 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"), lVar7 == 0))
                goto LAB_00102a67;
                iVar3 = xmlACatalogRemove(lVar7,*ppcVar1);
                if (iVar3 < 0) {
                  main_cold_5();
                  local_4d8 = 1;
                }
                goto LAB_00102af7;
              }
              lVar7 = 0;
              if ((noout & 1) == 0) goto LAB_00102b20;
LAB_00102b00:
              iVar3 = xmlCatalogIsEmpty(lVar6);
              if (iVar3 == 0) {
                pFVar11 = fopen64(*ppcVar1,"wb");
                if (pFVar11 == (FILE *)0x0) {
                  main_cold_6();
                  local_4d8 = 2;
                }
                else {
                  xmlACatalogDump(lVar6,pFVar11);
                  fclose(pFVar11);
                }
              }
              else {
                remove(*ppcVar1);
              }
              if ((lVar7 != 0) && (no_super_update == 0)) {
                iVar3 = xmlCatalogIsEmpty(lVar7);
                if (iVar3 == 0) {
                  pFVar11 = fopen64("/usr/local/etc/sgml/catalog","wb");
                  if (pFVar11 == (FILE *)0x0) {
                    main_cold_7();
                    local_4d8 = 2;
                  }
                  else {
                    xmlACatalogDump(lVar7,pFVar11);
                    fclose(pFVar11);
                  }
                }
                else {
                  remove("/usr/local/etc/sgml/catalog");
                }
              }
            }
            iVar3 = iVar17 + 2;
            xmlFreeCatalog(lVar6);
            xmlFreeCatalog(lVar7);
          }
        }
        else {
          iVar5 = strcmp(pcVar8,"-del");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar8,"--del"), iVar5 == 0)) {
            if (sgml != 0) goto LAB_0010296f;
            if (iVar4 == 0) goto LAB_00102a6f;
            iVar4 = strcmp(pcVar8,"-del");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar8,"--del"), iVar4 == 0)) {
              iVar3 = iVar17 + 1;
              iVar17 = xmlCatalogRemove(argv[(long)iVar17 + 1]);
              if (iVar17 < 0) {
                main_cold_3();
                local_4d8 = 1;
              }
            }
          }
        }
      }
      iVar17 = iVar3 + 1;
    } while (iVar17 < argc);
  }
  if ((sgml == 0) && ((((add != 0 || (del != 0)) || (create != 0)) || (convert != 0)))) {
    pFVar11 = _stdout;
    if ((((filename != (char *)0x0 & noout) == 1) && (*filename != '\0')) &&
       (pFVar11 = fopen64(filename,"wb"), pFVar11 == (FILE *)0x0)) {
      main_cold_8();
      local_4d8 = 2;
    }
    else {
      xmlCatalogDump(pFVar11);
    }
  }
  xmlCleanupParser();
  return local_4d8;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;

#ifdef _WIN32
    _setmode(_fileno(stdin), _O_BINARY);
    _setmode(_fileno(stdout), _O_BINARY);
    _setmode(_fileno(stderr), _O_BINARY);
#endif

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }

            /*
             * Catalogs are loaded lazily. Make sure that dumping works
             * by the issuing a dummy request that forces the catalog to
             * be loaded.
             */
            xmlCatalogResolvePublic(BAD_CAST "");
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "wb");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "wb");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;

                xmlFreeCatalog(catal);
                xmlFreeCatalog(super);
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "wb");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    return(exit_value);
}